

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

string * fs_get_shell_abi_cxx11_(void)

{
  passwd *ppVar1;
  string *in_RDI;
  string_view fname;
  allocator<char> local_19;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  ppVar1 = fs_getpwuid();
  if (ppVar1 == (passwd *)0x0) {
    fname._M_str = "fs_get_shell";
    fname._M_len = 0xc;
    fs_print_error((string_view)(ZEXT816(0x1186dc) << 0x40),fname,&ec);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,ppVar1->pw_shell,&local_19);
  }
  return in_RDI;
}

Assistant:

std::string
fs_get_shell()
{

  std::error_code ec;

#if defined(_WIN32)
  const HANDLE h = CreateToolhelp32Snapshot(TH32CS_SNAPPROCESS, 0);
  // 0: current process
  PROCESSENTRY32 pe;
  ZeroMemory(&pe, sizeof(PROCESSENTRY32));
  pe.dwSize = sizeof(PROCESSENTRY32);
  HMODULE hMod;
  DWORD cbNeeded;

  std::string name(fs_get_max_path(), '\0');

  if( Process32First(h, &pe)) {
    const DWORD pid = GetCurrentProcessId();
    do {
      if (pe.th32ProcessID == pid) {
        HANDLE hProcess = OpenProcess( PROCESS_QUERY_INFORMATION | PROCESS_VM_READ, FALSE, pe.th32ParentProcessID);

        if ( EnumProcessModules( hProcess, &hMod, sizeof(hMod), &cbNeeded) ) {
          if(DWORD L = GetModuleBaseNameA( hProcess, hMod, name.data(), static_cast<DWORD>(name.size()) );
              !CloseHandle(hProcess) || L == 0)
            ec = std::make_error_code(std::errc::io_error);
          else
            name.resize(L);

          break;
        }
if(fs_trace) std::cout << "TRACE: get_shell: " << name << " PID: " << pid << " PPID: " << pe.th32ParentProcessID << "\n";
      }
    } while( Process32Next(h, &pe));
  }

  if (CloseHandle(h) && !ec)
    return name;
#else
  if (auto pw = fs_getpwuid())
    return pw->pw_shell;
#endif

  fs_print_error("", __func__, ec);
  return {};
}